

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_hlsl_entry_point(CompilerHLSL *this)

{
  ParsedIR *this_00;
  ExecutionModel EVar1;
  uint32_t uVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  SPIREntryPoint *pSVar7;
  SPIRFunction *pSVar8;
  SPIRVariable *pSVar9;
  SPIRType *pSVar10;
  long lVar11;
  SPIRConstant *pSVar12;
  SPIREntryPoint *pSVar13;
  CompilerError *pCVar14;
  uint uVar15;
  char *pcVar16;
  uint32_t __val;
  TypedID<(spirv_cross::Types)0> *pTVar17;
  Bitset *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  Parameter *arg;
  long lVar19;
  Parameter *pPVar20;
  uint32_t i;
  uint32_t __val_00;
  uint32_t uVar21;
  ulong uVar22;
  TypedID<(spirv_cross::Types)0> *pTVar23;
  uint32_t i_1;
  uint uVar24;
  __node_base *p_Var25;
  bool legacy;
  string y_expr;
  SpecializationConstant wg_y;
  string z_expr;
  SpecializationConstant wg_z;
  SpecializationConstant wg_x;
  string x_expr;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arguments;
  
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &arguments.stack_storage;
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arguments.buffer_capacity = 8;
  if (this->require_input == true) {
    ::std::__cxx11::string::string
              ((string *)&x_expr,"SPIRV_Cross_Input stage_input",(allocator *)&y_expr);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arguments,&x_expr);
    ::std::__cxx11::string::~string((string *)&x_expr);
  }
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  EVar1 = pSVar7->model;
  if (EVar1 == ExecutionModelFragment) {
    if (((pSVar7->flags).lower & 0x200) != 0) {
      CompilerGLSL::statement<char_const(&)[20]>
                (&this->super_CompilerGLSL,(char (*) [20])"[earlydepthstencil]");
    }
  }
  else {
    if ((EVar1 != ExecutionModelGLCompute) && (EVar1 != ExecutionModelTaskEXT)) {
      if (EVar1 != ExecutionModelMeshEXT) goto LAB_002c3742;
      this_01 = &pSVar7->flags;
      bVar5 = Bitset::get(this_01,0x14b2);
      if (bVar5) {
        CompilerGLSL::statement<char_const(&)[29]>
                  (&this->super_CompilerGLSL,(char (*) [29])"[outputtopology(\"triangle\")]");
      }
      else {
        bVar5 = Bitset::get(this_01,0x1495);
        if (bVar5) {
          CompilerGLSL::statement<char_const(&)[25]>
                    (&this->super_CompilerGLSL,(char (*) [25])"[outputtopology(\"line\")]");
        }
        else if (((pSVar7->flags).lower & 0x8000000) != 0) {
          pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&x_expr,"Topology mode \"points\" is not supported in DirectX",
                     (allocator *)&y_expr);
          CompilerError::CompilerError(pCVar14,&x_expr);
          __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pSVar8 = Compiler::get<spirv_cross::SPIRFunction>
                         ((Compiler *)this,
                          (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      pPVar20 = (pSVar8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
      sVar3 = (pSVar8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
      ;
      for (lVar11 = 0; sVar3 * 0x14 != lVar11; lVar11 = lVar11 + 0x14) {
        pSVar9 = Compiler::get<spirv_cross::SPIRVariable>
                           ((Compiler *)this,*(uint32_t *)((long)&(pPVar20->id).id + lVar11));
        pSVar10 = Compiler::get<spirv_cross::SPIRType>
                            ((Compiler *)this,*(uint32_t *)&(pSVar9->super_IVariant).field_0xc);
        bVar5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBlock);
        if (pSVar9->storage == StorageClassTaskPayloadWorkgroupEXT) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&y_expr,this,pSVar9);
          ::std::operator+(&x_expr,"in payload ",&y_expr);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&arguments,&x_expr);
          ::std::__cxx11::string::~string((string *)&x_expr);
          pbVar18 = &y_expr;
LAB_002c352b:
          ::std::__cxx11::string::~string((string *)pbVar18);
        }
        else {
          if (!bVar5) {
            bVar5 = Bitset::get(this_01,0x14b2);
            if (bVar5) {
              ::std::__cxx11::to_string(&z_expr,pSVar7->output_primitives);
              ::std::operator+(&y_expr,"out indices uint3 gl_PrimitiveTriangleIndicesEXT[",&z_expr);
              ::std::operator+(&x_expr,&y_expr,"]");
            }
            else {
              ::std::__cxx11::to_string(&z_expr,pSVar7->output_primitives);
              ::std::operator+(&y_expr,"out indices uint2 gl_PrimitiveLineIndicesEXT[",&z_expr);
              ::std::operator+(&x_expr,&y_expr,"]");
            }
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&x_expr);
            ::std::__cxx11::string::~string((string *)&x_expr);
            ::std::__cxx11::string::~string((string *)&y_expr);
            pbVar18 = &z_expr;
            goto LAB_002c352b;
          }
          Compiler::get_buffer_block_flags
                    ((Bitset *)&x_expr,(Compiler *)this,(VariableID)(pSVar9->super_IVariant).self.id
                    );
          bVar5 = Bitset::get((Bitset *)&x_expr,0x1497);
          if ((bVar5) ||
             (bVar5 = Compiler::has_decoration
                                ((Compiler *)this,
                                 (ID)*(uint32_t *)((long)&(pPVar20->id).id + lVar11),
                                 DecorationPerPrimitiveEXT), bVar5)) {
            ::std::__cxx11::to_string((string *)&wg_x,pSVar7->output_primitives);
            ::std::operator+(&z_expr,"out primitives gl_MeshPerPrimitiveEXT gl_MeshPrimitivesEXT[",
                             (string *)&wg_x);
            ::std::operator+(&y_expr,&z_expr,"]");
          }
          else {
            ::std::__cxx11::to_string((string *)&wg_x,pSVar7->output_vertices);
            ::std::operator+(&z_expr,"out vertices gl_MeshPerVertexEXT gl_MeshVerticesEXT[",
                             (string *)&wg_x);
            ::std::operator+(&y_expr,&z_expr,"]");
          }
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&arguments,&y_expr);
          ::std::__cxx11::string::~string((string *)&y_expr);
          ::std::__cxx11::string::~string((string *)&z_expr);
          ::std::__cxx11::string::~string((string *)&wg_x);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&x_expr._M_string_length);
        }
      }
    }
    wg_x.id.id = 0;
    wg_y.id.id = 0;
    wg_z = (SpecializationConstant)((ulong)wg_z & 0xffffffff00000000);
    Compiler::get_work_group_size_specialization_constants((Compiler *)this,&wg_x,&wg_y,&wg_z);
    uVar21 = (pSVar7->workgroup_size).x;
    __val_00 = (pSVar7->workgroup_size).y;
    __val = (pSVar7->workgroup_size).z;
    if (((pSVar7->workgroup_size).constant == 0) && (((pSVar7->flags).lower & 0x4000000000) != 0)) {
      uVar2 = (pSVar7->workgroup_size).id_x;
      if (uVar2 != 0) {
        pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
        uVar21 = (pSVar12->m).c[0].r[0].u32;
      }
      uVar2 = (pSVar7->workgroup_size).id_y;
      if (uVar2 != 0) {
        pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
        __val_00 = (pSVar12->m).c[0].r[0].u32;
      }
      uVar2 = (pSVar7->workgroup_size).id_z;
      if (uVar2 != 0) {
        pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
        __val = (pSVar12->m).c[0].r[0].u32;
      }
    }
    if (wg_x.id.id == 0) {
      ::std::__cxx11::to_string(&x_expr,uVar21);
    }
    else {
      pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,wg_x.id.id);
      ::std::__cxx11::string::string
                ((string *)&x_expr,(string *)&pSVar12->specialization_constant_macro_name);
    }
    if (wg_y.id.id == 0) {
      ::std::__cxx11::to_string(&y_expr,__val_00);
    }
    else {
      pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,wg_y.id.id);
      ::std::__cxx11::string::string
                ((string *)&y_expr,(string *)&pSVar12->specialization_constant_macro_name);
    }
    if (wg_z.id.id == 0) {
      ::std::__cxx11::to_string(&z_expr,__val);
    }
    else {
      pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,wg_z.id.id);
      ::std::__cxx11::string::string
                ((string *)&z_expr,(string *)&pSVar12->specialization_constant_macro_name);
    }
    CompilerGLSL::
    statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])"[numthreads(",&x_expr,
               (char (*) [3])0x3b2a97,&y_expr,(char (*) [3])0x3b2a97,&z_expr,(char (*) [3])0x3a23a5)
    ;
    ::std::__cxx11::string::~string((string *)&z_expr);
    ::std::__cxx11::string::~string((string *)&y_expr);
    ::std::__cxx11::string::~string((string *)&x_expr);
  }
LAB_002c3742:
  if ((this->hlsl_options).use_entry_point_name == true) {
    pSVar13 = Compiler::get_entry_point((Compiler *)this);
    wg_z = (SpecializationConstant)(pSVar13->name)._M_dataplus._M_p;
  }
  else {
    wg_z = (SpecializationConstant)((long)"frag_main" + 5);
  }
  pcVar16 = "void ";
  if (this->require_output != false) {
    pcVar16 = "SPIRV_Cross_Output ";
  }
  y_expr._M_dataplus._M_p = pcVar16;
  merge(&x_expr,&arguments,", ");
  pcVar16 = (char *)&x_expr;
  CompilerGLSL::
  statement<char_const*,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char **)&y_expr,(char **)&wg_z,(char (*) [2])0x3b5f90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar16,
             (char (*) [2])0x39e39a);
  ::std::__cxx11::string::~string((string *)&x_expr);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  legacy = (this->hlsl_options).shader_model < 0x1f;
  y_expr._M_string_length = (size_type)&legacy;
  y_expr._M_dataplus._M_p = (pointer)this;
  for (uVar22 = 0; uVar22 != 0x40; uVar22 = uVar22 + 1) {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar22 & 0x3f) &
        1) != 0) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,(uint32_t)uVar22);
    }
  }
  sVar3 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (sVar3 != 0) {
    x_expr._M_dataplus._M_p = (pointer)((long)&x_expr.field_2 + 8);
    x_expr._M_string_length = 0;
    x_expr.field_2._M_allocated_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar3);
    p_Var25 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
               _M_before_begin;
    while (p_Var25 = p_Var25->_M_nxt, p_Var25 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)&x_expr,(uint *)(p_Var25 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (x_expr._M_dataplus._M_p,x_expr._M_dataplus._M_p + x_expr._M_string_length * 4);
    _Var4 = x_expr._M_dataplus;
    lVar11 = x_expr._M_string_length << 2;
    for (lVar19 = 0; lVar11 != lVar19; lVar19 = lVar19 + 4) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,*(uint32_t *)(_Var4._M_p + lVar19));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&x_expr);
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar23 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar17 = pTVar23 + (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (; pTVar23 != pTVar17; pTVar23 = pTVar23 + 1) {
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [pTVar23->id].type == TypeVariable) {
      pSVar9 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,pTVar23->id);
      pSVar10 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,*(uint32_t *)&(pSVar9->super_IVariant).field_0xc);
      bVar5 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBlock);
      if (((pSVar9->storage == StorageClassInput) && (pSVar9->remapped_variable == false)) &&
         (pSVar10->pointer == true)) {
        EVar1 = pSVar7->model;
        bVar6 = Compiler::is_builtin_variable((Compiler *)this,pSVar9);
        if ((!bVar6) &&
           (bVar6 = Compiler::interface_variable_exists_in_entry_point
                              ((Compiler *)this,(pSVar9->super_IVariant).self.id), bVar6)) {
          if (bVar5) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar10->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&y_expr,this,(ulong)(pSVar9->super_IVariant).self.id);
            for (uVar24 = 0;
                uVar24 < (uint)(pSVar10->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size; uVar24 = uVar24 + 1) {
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&z_expr,&this->super_CompilerGLSL,pSVar10,uVar24);
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        ((string *)&wg_x,(spirv_cross *)&x_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3a29dc,(char (*) [2])&z_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pcVar16);
              pcVar16 = " = stage_input.";
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,&y_expr,(char (*) [2])0x39e0a7,&z_expr,
                         (char (*) [16])0x3a4c04,(string *)&wg_x,(char (*) [2])0x39d4f0);
              ::std::__cxx11::string::~string((string *)&wg_x);
              ::std::__cxx11::string::~string((string *)&z_expr);
            }
            ::std::__cxx11::string::~string((string *)&y_expr);
          }
          else {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar9->super_IVariant).self.id);
            pSVar10 = Compiler::get<spirv_cross::SPIRType>
                                ((Compiler *)this,*(uint32_t *)&(pSVar9->super_IVariant).field_0xc);
            if ((EVar1 == ExecutionModelVertex) && (uVar24 = pSVar10->columns, 1 < uVar24)) {
              uVar15 = 0;
              while( true ) {
                y_expr._M_dataplus._M_p._0_4_ = uVar15;
                if (uVar24 <= uVar15) break;
                pcVar16 = "] = stage_input.";
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[17],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,&x_expr,(char (*) [2])0x3a24a1,(uint *)&y_expr,
                           (char (*) [17])"] = stage_input.",&x_expr,(char (*) [2])0x3a29dc,
                           (uint *)&y_expr,(char (*) [2])0x39d4f0);
                uVar15 = (uint)y_expr._M_dataplus._M_p + 1;
                uVar24 = pSVar10->columns;
              }
            }
            else {
              pcVar16 = ";";
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,&x_expr,(char (*) [16])0x3a4c04,&x_expr,
                         (char (*) [2])0x39d4f0);
            }
          }
          ::std::__cxx11::string::~string((string *)&x_expr);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
  EVar1 = pSVar7->model;
  if (((ExecutionModelGLCompute < EVar1) || ((0x31U >> (EVar1 & 0x1f) & 1) == 0)) &&
     (1 < EVar1 - ExecutionModelTaskEXT)) {
    pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&x_expr,"Unsupported shader stage.",(allocator *)&y_expr);
    CompilerError::CompilerError(pCVar14,&x_expr);
    __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  x_expr._M_string_length = 0;
  x_expr.field_2._M_allocated_capacity = 8;
  x_expr._M_dataplus._M_p = (pointer)(&x_expr.field_2._M_allocated_capacity + 1);
  pSVar8 = Compiler::get<spirv_cross::SPIRFunction>
                     ((Compiler *)this,
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  pPVar20 = (pSVar8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar11 = (pSVar8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                buffer_size * 0x14; lVar11 != 0; lVar11 = lVar11 + -0x14) {
    CompilerGLSL::to_expression_abi_cxx11_(&y_expr,&this->super_CompilerGLSL,(pPVar20->id).id,false)
    ;
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&x_expr,&y_expr);
    ::std::__cxx11::string::~string((string *)&y_expr);
    pPVar20 = pPVar20 + 1;
  }
  get_inner_entry_point_name_abi_cxx11_(&y_expr,this);
  merge(&z_expr,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&x_expr,", ");
  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39d4ef;
  CompilerGLSL::
  statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
            (&this->super_CompilerGLSL,&y_expr,(char (*) [2])0x3b5f90,&z_expr,(char (*) [3])0x39d4ef
            );
  ::std::__cxx11::string::~string((string *)&z_expr);
  ::std::__cxx11::string::~string((string *)&y_expr);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)&x_expr);
  if (this->require_output != false) {
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"SPIRV_Cross_Output stage_output;");
    y_expr._M_dataplus._M_p = &legacy;
    y_expr._M_string_length = (size_type)this;
    for (uVar22 = 0; uVar22 != 0x40; uVar22 = uVar22 + 1) {
      if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar22 & 0x3f)
          & 1) != 0) {
        emit_hlsl_entry_point::anon_class_16_2_1de67c4e::operator()
                  ((anon_class_16_2_1de67c4e *)&y_expr,(uint32_t)uVar22);
      }
    }
    sVar3 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
            _M_element_count;
    if (sVar3 != 0) {
      x_expr._M_string_length = 0;
      x_expr.field_2._M_allocated_capacity = 8;
      x_expr._M_dataplus._M_p = (pointer)(&x_expr.field_2._M_allocated_capacity + 1);
      SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar3);
      p_Var25 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                 _M_before_begin;
      while (p_Var25 = p_Var25->_M_nxt, p_Var25 != (__node_base *)0x0) {
        SmallVector<unsigned_int,_8UL>::push_back
                  ((SmallVector<unsigned_int,_8UL> *)&x_expr,(uint *)(p_Var25 + 1));
      }
      ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (x_expr._M_dataplus._M_p,x_expr._M_dataplus._M_p + x_expr._M_string_length * 4);
      _Var4 = x_expr._M_dataplus;
      lVar11 = x_expr._M_string_length << 2;
      for (lVar19 = 0; lVar11 != lVar19; lVar19 = lVar19 + 4) {
        emit_hlsl_entry_point::anon_class_16_2_1de67c4e::operator()
                  ((anon_class_16_2_1de67c4e *)&y_expr,*(uint32_t *)(_Var4._M_p + lVar19));
      }
      SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&x_expr);
    }
    ParsedIR::create_loop_hard_lock(this_00);
    pTVar17 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar23 = pTVar17 + (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (; pTVar17 != pTVar23; pTVar17 = pTVar17 + 1) {
      if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[pTVar17->id].type == TypeVariable) {
        pSVar9 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,pTVar17->id);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>
                            ((Compiler *)this,*(uint32_t *)&(pSVar9->super_IVariant).field_0xc);
        bVar5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBlock);
        if (((pSVar9->storage == StorageClassOutput) && (pSVar9->remapped_variable == false)) &&
           ((pSVar10->pointer == true &&
            ((bVar6 = Compiler::is_builtin_variable((Compiler *)this,pSVar9), !bVar6 &&
             (bVar6 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(pSVar9->super_IVariant).self.id), bVar6)))))) {
          if (bVar5) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar10->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&y_expr,this,(ulong)(pSVar9->super_IVariant).self.id,1);
            for (uVar24 = 0;
                uVar24 < (uint)(pSVar10->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size; uVar24 = uVar24 + 1) {
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&z_expr,&this->super_CompilerGLSL,pSVar10,uVar24);
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        ((string *)&wg_x,(spirv_cross *)&x_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3a29dc,(char (*) [2])&z_expr,pbVar18);
              pbVar18 = &y_expr;
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",(string *)&wg_x,
                         (char (*) [4])0x3b58ce,pbVar18,(char (*) [2])0x39e0a7,&z_expr,
                         (char (*) [2])0x39d4f0);
              ::std::__cxx11::string::~string((string *)&wg_x);
              ::std::__cxx11::string::~string((string *)&z_expr);
            }
            ::std::__cxx11::string::~string((string *)&y_expr);
          }
          else {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar9->super_IVariant).self.id,1);
            if ((legacy == true) && (pSVar7->model == ExecutionModelFragment)) {
              y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
              y_expr._M_string_length = 0;
              y_expr.field_2._M_local_buf[0] = '\0';
              for (uVar21 = pSVar10->vecsize; uVar21 < 4; uVar21 = uVar21 + 1) {
                ::std::__cxx11::string::append((char *)&y_expr);
              }
              pbVar18 = &x_expr;
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",pbVar18,
                         (char (*) [11])" = float4(",pbVar18,&y_expr,(char (*) [3])0x39d4ef);
              ::std::__cxx11::string::~string((string *)&y_expr);
            }
            else {
              pbVar18 = &x_expr;
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",pbVar18,
                         (char (*) [4])0x3b58ce,pbVar18,(char (*) [2])0x39d4f0);
            }
          }
          ::std::__cxx11::string::~string((string *)&x_expr);
        }
      }
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
    CompilerGLSL::statement<char_const(&)[21]>
              (&this->super_CompilerGLSL,(char (*) [21])"return stage_output;");
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&arguments);
  return;
}

Assistant:

void CompilerHLSL::emit_hlsl_entry_point()
{
	SmallVector<string> arguments;

	if (require_input)
		arguments.push_back("SPIRV_Cross_Input stage_input");

	auto &execution = get_entry_point();

	switch (execution.model)
	{
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	case ExecutionModelGLCompute:
	{
		if (execution.model == ExecutionModelMeshEXT)
		{
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				statement("[outputtopology(\"triangle\")]");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				statement("[outputtopology(\"line\")]");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				SPIRV_CROSS_THROW("Topology mode \"points\" is not supported in DirectX");

			auto &func = get<SPIRFunction>(ir.default_entry_point);
			for (auto &arg : func.arguments)
			{
				auto &var = get<SPIRVariable>(arg.id);
				auto &base_type = get<SPIRType>(var.basetype);
				bool block = has_decoration(base_type.self, DecorationBlock);
				if (var.storage == StorageClassTaskPayloadWorkgroupEXT)
				{
					arguments.push_back("in payload " + variable_decl(var));
				}
				else if (block)
				{
					auto flags = get_buffer_block_flags(var.self);
					if (flags.get(DecorationPerPrimitiveEXT) || has_decoration(arg.id, DecorationPerPrimitiveEXT))
					{
						arguments.push_back("out primitives gl_MeshPerPrimitiveEXT gl_MeshPrimitivesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out vertices gl_MeshPerVertexEXT gl_MeshVerticesEXT[" +
						                    std::to_string(execution.output_vertices) + "]");
					}
				}
				else
				{
					if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
					{
						arguments.push_back("out indices uint3 gl_PrimitiveTriangleIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out indices uint2 gl_PrimitiveLineIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
				}
			}
		}
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		uint32_t x = execution.workgroup_size.x;
		uint32_t y = execution.workgroup_size.y;
		uint32_t z = execution.workgroup_size.z;

		if (!execution.workgroup_size.constant && execution.flags.get(ExecutionModeLocalSizeId))
		{
			if (execution.workgroup_size.id_x)
				x = get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			if (execution.workgroup_size.id_y)
				y = get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			if (execution.workgroup_size.id_z)
				z = get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
		}

		auto x_expr = wg_x.id ? get<SPIRConstant>(wg_x.id).specialization_constant_macro_name : to_string(x);
		auto y_expr = wg_y.id ? get<SPIRConstant>(wg_y.id).specialization_constant_macro_name : to_string(y);
		auto z_expr = wg_z.id ? get<SPIRConstant>(wg_z.id).specialization_constant_macro_name : to_string(z);

		statement("[numthreads(", x_expr, ", ", y_expr, ", ", z_expr, ")]");
		break;
	}
	case ExecutionModelFragment:
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			statement("[earlydepthstencil]");
		break;
	default:
		break;
	}

	const char *entry_point_name;
	if (hlsl_options.use_entry_point_name)
		entry_point_name = get_entry_point().name.c_str();
	else
		entry_point_name = "main";

	statement(require_output ? "SPIRV_Cross_Output " : "void ", entry_point_name, "(", merge(arguments), ")");
	begin_scope();
	bool legacy = hlsl_options.shader_model <= 30;

	// Copy builtins from entry point arguments to globals.
	active_input_builtins.for_each_bit([&](uint32_t i) {
		auto builtin = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassInput);
		switch (static_cast<BuiltIn>(i))
		{
		case BuiltInFragCoord:
			// VPOS in D3D9 is sampled at integer locations, apply half-pixel offset to be consistent.
			// TODO: Do we need an option here? Any reason why a D3D9 shader would be used
			// on a D3D10+ system with a different rasterization config?
			if (legacy)
				statement(builtin, " = stage_input.", builtin, " + float4(0.5f, 0.5f, 0.0f, 0.0f);");
			else
			{
				statement(builtin, " = stage_input.", builtin, ";");
				// ZW are undefined in D3D9, only do this fixup here.
				statement(builtin, ".w = 1.0 / ", builtin, ".w;");
			}
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			// D3D semantics are uint, but shader wants int.
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
			{
				if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseInstance;");
				else
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseVertex;");
			}
			else
				statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInBaseVertex:
			statement(builtin, " = SPIRV_Cross_BaseVertex;");
			break;

		case BuiltInBaseInstance:
			statement(builtin, " = SPIRV_Cross_BaseInstance;");
			break;

		case BuiltInInstanceId:
			// D3D semantics are uint, but shader wants int.
			statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
		case BuiltInHelperInvocation:
			break;

		case BuiltInSubgroupEqMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupEqMask = 1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96));");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupEqMask.x = 0;");
			statement("if (WaveGetLaneIndex() >= 64 || WaveGetLaneIndex() < 32) gl_SubgroupEqMask.y = 0;");
			statement("if (WaveGetLaneIndex() >= 96 || WaveGetLaneIndex() < 64) gl_SubgroupEqMask.z = 0;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupEqMask.w = 0;");
			break;

		case BuiltInSubgroupGeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupGeMask = ~((1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupGeMask.x = 0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupGeMask.y = 0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupGeMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupGeMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupGeMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupGeMask.w = ~0u;");
			break;

		case BuiltInSubgroupGtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint gt_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupGtMask = ~((1u << (gt_lane_index - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (gt_lane_index >= 32) gl_SubgroupGtMask.x = 0u;");
			statement("if (gt_lane_index >= 64) gl_SubgroupGtMask.y = 0u;");
			statement("if (gt_lane_index >= 96) gl_SubgroupGtMask.z = 0u;");
			statement("if (gt_lane_index >= 128) gl_SubgroupGtMask.w = 0u;");
			statement("if (gt_lane_index < 32) gl_SubgroupGtMask.y = ~0u;");
			statement("if (gt_lane_index < 64) gl_SubgroupGtMask.z = ~0u;");
			statement("if (gt_lane_index < 96) gl_SubgroupGtMask.w = ~0u;");
			break;

		case BuiltInSubgroupLeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint le_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupLeMask = (1u << (le_lane_index - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (le_lane_index >= 32) gl_SubgroupLeMask.x = ~0u;");
			statement("if (le_lane_index >= 64) gl_SubgroupLeMask.y = ~0u;");
			statement("if (le_lane_index >= 96) gl_SubgroupLeMask.z = ~0u;");
			statement("if (le_lane_index >= 128) gl_SubgroupLeMask.w = ~0u;");
			statement("if (le_lane_index < 32) gl_SubgroupLeMask.y = 0u;");
			statement("if (le_lane_index < 64) gl_SubgroupLeMask.z = 0u;");
			statement("if (le_lane_index < 96) gl_SubgroupLeMask.w = 0u;");
			break;

		case BuiltInSubgroupLtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupLtMask = (1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupLtMask.x = ~0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupLtMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupLtMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupLtMask.y = 0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupLtMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupLtMask.w = 0u;");
			break;

		case BuiltInClipDistance:
			for (uint32_t clip = 0; clip < clip_distance_count; clip++)
				statement("gl_ClipDistance[", clip, "] = stage_input.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3],
				          ";");
			break;

		case BuiltInCullDistance:
			for (uint32_t cull = 0; cull < cull_distance_count; cull++)
				statement("gl_CullDistance[", cull, "] = stage_input.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3],
				          ";");
			break;

		default:
			statement(builtin, " = stage_input.", builtin, ";");
			break;
		}
	});

	// Copy from stage input struct to globals.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);

		if (var.storage != StorageClassInput)
			return;

		bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

		if (!var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self))
		{
			if (block)
			{
				auto type_name = to_name(type.self);
				auto var_name = to_name(var.self);
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
				{
					auto mbr_name = to_member_name(type, mbr_idx);
					auto flat_name = join(type_name, "_", mbr_name);
					statement(var_name, ".", mbr_name, " = stage_input.", flat_name, ";");
				}
			}
			else
			{
				auto name = to_name(var.self);
				auto &mtype = this->get<SPIRType>(var.basetype);
				if (need_matrix_unroll && mtype.columns > 1)
				{
					// Unroll matrices.
					for (uint32_t col = 0; col < mtype.columns; col++)
						statement(name, "[", col, "] = stage_input.", name, "_", col, ";");
				}
				else
				{
					statement(name, " = stage_input.", name, ";");
				}
			}
		}
	});

	// Run the shader.
	if (execution.model == ExecutionModelVertex ||
	    execution.model == ExecutionModelFragment ||
	    execution.model == ExecutionModelGLCompute ||
	    execution.model == ExecutionModelMeshEXT ||
	    execution.model == ExecutionModelTaskEXT)
	{
		// For mesh shaders, we receive special arguments that we must pass down as function arguments.
		// HLSL does not support proper reference types for passing these IO blocks,
		// but DXC post-inlining seems to magically fix it up anyways *shrug*.
		SmallVector<string> arglist;
		auto &func = get<SPIRFunction>(ir.default_entry_point);
		// The arguments are marked out, avoid detecting reads and emitting inout.
		for (auto &arg : func.arguments)
			arglist.push_back(to_expression(arg.id, false));
		statement(get_inner_entry_point_name(), "(", merge(arglist), ");");
	}
	else
		SPIRV_CROSS_THROW("Unsupported shader stage.");

	// Copy stage outputs.
	if (require_output)
	{
		statement("SPIRV_Cross_Output stage_output;");

		// Copy builtins from globals to return struct.
		active_output_builtins.for_each_bit([&](uint32_t i) {
			// PointSize doesn't exist in HLSL SM 4+.
			if (i == BuiltInPointSize && !legacy)
				return;

			switch (static_cast<BuiltIn>(i))
			{
			case BuiltInClipDistance:
				for (uint32_t clip = 0; clip < clip_distance_count; clip++)
					statement("stage_output.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3], " = gl_ClipDistance[",
					          clip, "];");
				break;

			case BuiltInCullDistance:
				for (uint32_t cull = 0; cull < cull_distance_count; cull++)
					statement("stage_output.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3], " = gl_CullDistance[",
					          cull, "];");
				break;

			default:
			{
				auto builtin_expr = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassOutput);
				statement("stage_output.", builtin_expr, " = ", builtin_expr, ";");
				break;
			}
			}
		});

		ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
			auto &type = this->get<SPIRType>(var.basetype);
			bool block = has_decoration(type.self, DecorationBlock);

			if (var.storage != StorageClassOutput)
				return;

			if (!var.remapped_variable && type.pointer &&
			    !is_builtin_variable(var) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				if (block)
				{
					// I/O blocks need to flatten output.
					auto type_name = to_name(type.self);
					auto var_name = to_name(var.self);
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
					{
						auto mbr_name = to_member_name(type, mbr_idx);
						auto flat_name = join(type_name, "_", mbr_name);
						statement("stage_output.", flat_name, " = ", var_name, ".", mbr_name, ";");
					}
				}
				else
				{
					auto name = to_name(var.self);

					if (legacy && execution.model == ExecutionModelFragment)
					{
						string output_filler;
						for (uint32_t size = type.vecsize; size < 4; ++size)
							output_filler += ", 0.0";

						statement("stage_output.", name, " = float4(", name, output_filler, ");");
					}
					else
					{
						statement("stage_output.", name, " = ", name, ";");
					}
				}
			}
		});

		statement("return stage_output;");
	}

	end_scope();
}